

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

iterator * __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
::insert_at(iterator *__return_storage_ptr__,
           sparse_hashtable<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
           *this,const_reference obj,size_type pos)

{
  size_type *psVar1;
  ushort uVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  length_error *this_00;
  ulong uVar6;
  nonempty_iterator local_50;
  
  if ((this->table).settings.num_buckets - this->num_deleted < 0x1fffffffffffffff) {
    bVar5 = test_deleted(this,pos);
    if (bVar5) {
      this->num_deleted = this->num_deleted - 1;
    }
    psVar3 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = pos / 0x30;
    uVar2 = psVar3[uVar6].settings.num_buckets;
    sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::set(psVar3 + uVar6,(short)pos + (short)uVar6 * -0x30,obj);
    psVar1 = &(this->table).settings.num_buckets;
    *psVar1 = *psVar1 + ((ulong)(this->table).groups.
                                super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar6].settings.
                                num_buckets - (ulong)uVar2);
    sparsetable<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::get_iter(&local_50,&this->table,pos);
    psVar3 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<4,_4>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->pos).row_current._M_current = local_50.row_current._M_current;
    (__return_storage_ptr__->pos).col_current = local_50.col_current;
    (__return_storage_ptr__->pos).row_begin._M_current = local_50.row_begin._M_current;
    (__return_storage_ptr__->pos).row_end._M_current = local_50.row_end._M_current;
    __return_storage_ptr__->ht = this;
    (__return_storage_ptr__->end).row_begin._M_current = psVar3;
    (__return_storage_ptr__->end).row_end._M_current = psVar4;
    (__return_storage_ptr__->end).row_current._M_current = psVar4;
    (__return_storage_ptr__->end).col_current = (nonempty_iterator)0x0;
    sparse_hashtable_iterator<std::pair<const_HashObject<4,_4>,_int>,_HashObject<4,_4>,_HashFn,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<4,_4>,_int,_HashFn,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>::SetKey,_std::equal_to<HashObject<4,_4>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<4,_4>,_int>_>_>
    ::advance_past_deleted(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

iterator insert_at(const_reference obj, size_type pos) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been deleted
      // The set() below will undelete this object.  We just worry about
      // stats
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    }
    table.set(pos, obj);
    return iterator(this, table.get_iter(pos), table.nonempty_end());
  }